

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_2,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  VecAccess<float,_4,_3> local_70;
  Matrix<float,_2,_2> local_44;
  Vector<float,_3> local_34;
  undefined1 local_28 [8];
  Type in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,2>
              ((ShaderEvalContext *)&in1,(int)evalCtx);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,2>
              ((MatrixCaseUtils *)&in1,evalCtx,0);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,2>
              ((ShaderEvalContext *)local_28,(int)evalCtx);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,2>
              ((MatrixCaseUtils *)local_28,evalCtx,1);
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::outerProduct<float,2,2>
            ((MatrixCaseUtils *)&local_44,&in1,(Vector<float,_2> *)local_28);
  reduceToVec3((MatrixCaseUtils *)&local_34,(Mat2 *)&local_44);
  tcu::Vector<float,_4>::xyz(&local_70,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,&local_34);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_44);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}